

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubByteTypes.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
MILBlob::PackSubByteVecImpl<MILBlob::UInt1>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          MILBlob *this,Span<const_unsigned_char,_18446744073709551615UL> vec)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  byte *pbVar4;
  range_error *this_00;
  byte bVar5;
  string local_168;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  ulong local_48;
  size_t shiftAmmount;
  size_t i;
  allocator<unsigned_char> local_26;
  undefined1 local_25;
  undefined4 local_24;
  undefined1 auStack_20 [4];
  int ElementsPerByte;
  Span<const_unsigned_char,_18446744073709551615UL> vec_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *ret;
  
  vec_local.m_ptr = vec.m_ptr;
  local_24 = 8;
  local_25 = 0;
  _auStack_20 = this;
  vec_local.m_size.m_size = (size_t)__return_storage_ptr__;
  sVar2 = Util::Span<const_unsigned_char,_18446744073709551615UL>::Size
                    ((Span<const_unsigned_char,_18446744073709551615UL> *)auStack_20);
  sVar2 = SizeInBytes<MILBlob::UInt1>(sVar2);
  std::allocator<unsigned_char>::allocator(&local_26);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,sVar2,&local_26);
  std::allocator<unsigned_char>::~allocator(&local_26);
  shiftAmmount = 0;
  while( true ) {
    sVar2 = shiftAmmount;
    sVar3 = Util::Span<const_unsigned_char,_18446744073709551615UL>::Size
                      ((Span<const_unsigned_char,_18446744073709551615UL> *)auStack_20);
    if (sVar3 <= sVar2) {
      return __return_storage_ptr__;
    }
    local_48 = shiftAmmount & 7;
    pbVar4 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[]
                       ((Span<const_unsigned_char,_18446744073709551615UL> *)auStack_20,shiftAmmount
                       );
    if (1 < *pbVar4) break;
    Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[]
              ((Span<const_unsigned_char,_18446744073709551615UL> *)auStack_20,shiftAmmount);
    pbVar4 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[]
                       ((Span<const_unsigned_char,_18446744073709551615UL> *)auStack_20,shiftAmmount
                       );
    bVar1 = *pbVar4;
    bVar5 = (byte)local_48;
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (__return_storage_ptr__,shiftAmmount >> 3);
    *pbVar4 = *pbVar4 | (byte)((bVar1 & 1) << (bVar5 & 0x1f));
    shiftAmmount = shiftAmmount + 1;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  pbVar4 = Util::Span<const_unsigned_char,_18446744073709551615UL>::operator[]
                     ((Span<const_unsigned_char,_18446744073709551615UL> *)auStack_20,shiftAmmount);
  std::__cxx11::to_string(&local_128,(uint)*pbVar4);
  std::operator+(&local_108,"Value ",&local_128);
  std::operator+(&local_e8,&local_108," is outside allowed subbyte datatype range [");
  std::__cxx11::to_string(&local_148,0);
  std::operator+(&local_c8,&local_e8,&local_148);
  std::operator+(&local_a8,&local_c8,", ");
  std::__cxx11::to_string(&local_168,1);
  std::operator+(&local_88,&local_a8,&local_168);
  std::operator+(&local_68,&local_88,"].");
  std::range_error::range_error(this_00,(string *)&local_68);
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

std::vector<uint8_t> PackSubByteVecImpl(Util::Span<const decltype(T::data)> vec)
{
    if constexpr (!MILBlob::SubByteIsByteAligned<T>()) {
        return PackSubByteVecForNonByteAligned<T>(vec);
    }
    const auto ElementsPerByte = 8 / T::SizeInBits;
    std::vector<uint8_t> ret(MILBlob::SizeInBytes<T>(vec.Size()));
    for (size_t i = 0; i < vec.Size(); i++) {
        size_t shiftAmmount = T::SizeInBits * (i % ElementsPerByte);
        MILVerifyIsTrue(vec[i] <= T::MAX && vec[i] >= T::MIN,
                        std::range_error,
                        "Value " + std::to_string(vec[i]) + " is outside allowed subbyte datatype range [" +
                            std::to_string(T::MIN) + ", " + std::to_string(T::MAX) + "].");
        ret[i / ElementsPerByte] |= (static_cast<uint8_t>((vec[i] & T::BitMask) << shiftAmmount));
    }
    return ret;
}